

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjLoader.cpp
# Opt level: O2

void __thiscall ObjLoader::saveBinaryFile(ObjLoader *this,string *filename)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar1;
  uchar *puVar2;
  pointer pSVar3;
  Image<unsigned_char> *pIVar4;
  size_t __n;
  size_t __n_00;
  size_t __n_01;
  size_t __n_02;
  size_t __n_03;
  size_t __n_04;
  size_t __n_05;
  size_t __n_06;
  size_t __n_07;
  size_t __n_08;
  size_t __n_09;
  size_t __n_10;
  size_t __n_11;
  size_t __n_12;
  size_t __n_13;
  IBO *ibo;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *v;
  int __fd;
  pointer pSVar5;
  pointer name;
  int32 h;
  int32 w;
  int32 c;
  int32 d;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  textureImageNames;
  uint64_t count;
  NamedTextureImages *local_238;
  ofstream file;
  
  std::ofstream::ofstream(&file,(filename->_M_dataplus)._M_p,_S_out);
  std::ostream::write((char *)&file,0x16ac54);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&w,"[VertexPositions]",(allocator<char> *)&textureImageNames);
  write((int)&w,&file,__n);
  std::__cxx11::string::~string((string *)&w);
  write<glm::vec<3,float,(glm::qualifier)0>>(&this->m_vertexPositions,(ostream *)&file);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&w,"[VertexColors]",(allocator<char> *)&textureImageNames);
  write((int)&w,&file,__n_00);
  std::__cxx11::string::~string((string *)&w);
  write<glm::vec<4,float,(glm::qualifier)0>>(&this->m_vertexColors,(ostream *)&file);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&w,"[VertexUVs]",(allocator<char> *)&textureImageNames);
  write((int)&w,&file,__n_01);
  std::__cxx11::string::~string((string *)&w);
  write<glm::vec<2,float,(glm::qualifier)0>>(&this->m_vertexUVs,(ostream *)&file);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&w,"[VertexNormals]",(allocator<char> *)&textureImageNames);
  write((int)&w,&file,__n_02);
  std::__cxx11::string::~string((string *)&w);
  write<glm::vec<3,float,(glm::qualifier)0>>(&this->m_vertexNormals,(ostream *)&file);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&w,"[VertexTangents]",(allocator<char> *)&textureImageNames);
  write((int)&w,&file,__n_03);
  std::__cxx11::string::~string((string *)&w);
  write<glm::vec<3,float,(glm::qualifier)0>>(&this->m_vertexTangents,(ostream *)&file);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&w,"[IBOS]",(allocator<char> *)&textureImageNames);
  write((int)&w,&file,__n_04);
  std::__cxx11::string::~string((string *)&w);
  count = ((long)(this->m_ibos).
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->m_ibos).
                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start) / 0x18;
  write<unsigned_long>(&count,(ostream *)&file);
  pvVar1 = (this->m_ibos).
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (v = (this->m_ibos).
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start; v != pvVar1; v = v + 1) {
    write<unsigned_int>(v,(ostream *)&file);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&w,"[NamedTextureImages]",(allocator<char> *)&textureImageNames);
  write((int)&w,&file,__n_05);
  std::__cxx11::string::~string((string *)&w);
  local_238 = &this->m_images;
  NamedTextureImages::names_abi_cxx11_(&textureImageNames,local_238);
  count = (long)textureImageNames.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)textureImageNames.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 5;
  write<unsigned_long>(&count,(ostream *)&file);
  for (name = textureImageNames.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
      name != textureImageNames.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish; name = name + 1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&w,"_Image_",(allocator<char> *)&h)
    ;
    write((int)(string *)&w,(ostream *)&file,__n_06);
    std::__cxx11::string::~string((string *)&w);
    write((int)name,(ostream *)&file,__n_07);
    pIVar4 = NamedTextureImages::operator[](local_238,name);
    w = pIVar4->width;
    h = pIVar4->height;
    d = pIVar4->depth;
    c = pIVar4->channels;
    puVar2 = pIVar4->data;
    write<int>((int *)&w,(ostream *)&file);
    write<int>((int *)&h,(ostream *)&file);
    write<int>(&d,(ostream *)&file);
    write<int>(&c,(ostream *)&file);
    std::ostream::write((char *)&file,(long)puVar2);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&w,"[SimpleMaterials]",(allocator<char> *)&h);
  write((int)&w,&file,__n_08);
  std::__cxx11::string::~string((string *)&w);
  count = ((long)(this->m_materials).
                 super__Vector_base<SimpleMaterial,_std::allocator<SimpleMaterial>_>._M_impl.
                 super__Vector_impl_data._M_finish -
          (long)(this->m_materials).
                super__Vector_base<SimpleMaterial,_std::allocator<SimpleMaterial>_>._M_impl.
                super__Vector_impl_data._M_start) / 0xa8;
  write<unsigned_long>(&count,(ostream *)&file);
  pSVar3 = (this->m_materials).super__Vector_base<SimpleMaterial,_std::allocator<SimpleMaterial>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pSVar5 = (this->m_materials).
                super__Vector_base<SimpleMaterial,_std::allocator<SimpleMaterial>_>._M_impl.
                super__Vector_impl_data._M_start; pSVar5 != pSVar3; pSVar5 = pSVar5 + 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&w,"_Material_",(allocator<char> *)&h);
    write((int)(string *)&w,(ostream *)&file,__n_09);
    std::__cxx11::string::~string((string *)&w);
    __fd = (int)pSVar5;
    write(__fd,(ostream *)&file,__n_10);
    write<glm::vec<3,float,(glm::qualifier)0>>(&pSVar5->ambient,(ostream *)&file);
    write<glm::vec<3,float,(glm::qualifier)0>>(&pSVar5->diffuse,(ostream *)&file);
    write<glm::vec<3,float,(glm::qualifier)0>>(&pSVar5->specular,(ostream *)&file);
    write<float>(&pSVar5->shininess,(ostream *)&file);
    write(__fd + 0x48,(ostream *)&file,__n_11);
    write(__fd + 0x68,(ostream *)&file,__n_12);
    write(__fd + 0x88,(ostream *)&file,__n_13);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&textureImageNames);
  std::ofstream::~ofstream(&file);
  return;
}

Assistant:

void ObjLoader::saveBinaryFile(const std::string & filename) const
{
#define GLITTER_BINFILE_MAGIC "GLITTER_BIN_OBJ\n"
  std::ofstream file(filename.c_str());
  file.write(GLITTER_BINFILE_MAGIC, strlen(GLITTER_BINFILE_MAGIC));

  write(std::string("[VertexPositions]"), file);
  write(m_vertexPositions, file);
  write(std::string("[VertexColors]"), file);
  write(m_vertexColors, file);
  write(std::string("[VertexUVs]"), file);
  write(m_vertexUVs, file);
  write(std::string("[VertexNormals]"), file);
  write(m_vertexNormals, file);
  write(std::string("[VertexTangents]"), file);
  write(m_vertexTangents, file);

  write(std::string("[IBOS]"), file);
  // IBOs
  std::uint64_t count = m_ibos.size();
  write(count, file);
  for (const IBO & ibo : m_ibos) {
    write(ibo, file);
  }

  write(std::string("[NamedTextureImages]"), file);
  // NamedTextureImages m_images;
  std::vector<std::string> textureImageNames = m_images.names();
  count = textureImageNames.size();
  write(count, file);
  for (const std::string & name : textureImageNames) {
    write(std::string("_Image_"), file);
    write(name, file);
    Image<> image = m_images[name];
    glm::int32 w = image.width;
    glm::int32 h = image.height;
    glm::int32 d = image.depth;
    glm::int32 c = image.channels;
    write(w, file);
    write(h, file);
    write(d, file);
    write(c, file);
    file.write(reinterpret_cast<const char *>(image.data), w * h * d * c);
  }

  write(std::string("[SimpleMaterials]"), file);
  // std::vector<SimpleMaterial> m_materials;
  count = m_materials.size();
  write(count, file);
  for (const SimpleMaterial & material : m_materials) {
    write(std::string("_Material_"), file);
    write(material.name, file);
    write(material.ambient, file);
    write(material.diffuse, file);
    write(material.specular, file);
    write(material.shininess, file);
    write(material.diffuseTexName, file);
    write(material.normalTexName, file);
    write(material.specularTexName, file);
  }
}